

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

Ptr __thiscall core::image::load_tiff_16_file(image *this,string *filename)

{
  image *this_00;
  long lVar1;
  uint uVar2;
  long lVar3;
  Image<unsigned_short> *__p;
  ulong uVar4;
  Exception *pEVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar6;
  ulong uVar7;
  Ptr PVar8;
  string local_70;
  image *local_50;
  int local_44;
  image *piStack_40;
  uint32 width;
  ushort local_38;
  short local_36;
  uint local_34;
  uint16 channels;
  uint16 bits;
  uint32 height;
  
  piStack_40 = this;
  TIFFSetWarningHandler(0);
  TIFFSetErrorHandler(tiff_error_handler);
  lVar3 = TIFFOpen((filename->_M_dataplus)._M_p,"r");
  if (lVar3 == 0) {
    pEVar5 = (Exception *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"TIFF file format not recognized","");
    util::Exception::Exception(pEVar5,&local_70);
    __cxa_throw(pEVar5,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  TIFFGetField(lVar3,0x100,&local_44);
  TIFFGetField(lVar3,0x101,&local_34);
  TIFFGetField(lVar3,0x115,&local_38);
  TIFFGetField(lVar3,0x102,&local_36);
  uVar2 = local_34;
  if (local_36 == 0x10) {
    __p = (Image<unsigned_short> *)operator_new(0x30);
    (__p->super_TypedImageBase<unsigned_short>).super_ImageBase.w = 0;
    (__p->super_TypedImageBase<unsigned_short>).super_ImageBase.h = 0;
    (__p->super_TypedImageBase<unsigned_short>).super_ImageBase.c = 0;
    (__p->super_TypedImageBase<unsigned_short>).data.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_short>).data.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_short>).data.
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->super_TypedImageBase<unsigned_short>).super_ImageBase._vptr_ImageBase =
         (_func_int **)&PTR__TypedImageBase_001309e0;
    if ((__p->super_TypedImageBase<unsigned_short>).data.
        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      (__p->super_TypedImageBase<unsigned_short>).data.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
    }
    (__p->super_TypedImageBase<unsigned_short>).super_ImageBase.w = local_44;
    (__p->super_TypedImageBase<unsigned_short>).super_ImageBase.h = uVar2;
    (__p->super_TypedImageBase<unsigned_short>).super_ImageBase.c = (uint)local_38;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              (&(__p->super_TypedImageBase<unsigned_short>).data,
               (long)(int)(uVar2 * local_44) * (ulong)local_38);
    *(Image<unsigned_short> **)piStack_40 = __p;
    this_00 = piStack_40 + 8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<core::Image<unsigned_short>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,__p);
    local_50 = this_00;
    uVar4 = TIFFScanlineSize(lVar3);
    if (local_34 != 0) {
      lVar1 = *(long *)piStack_40;
      uVar7 = 0;
      uVar6 = 0;
      do {
        TIFFReadScanline(lVar3,(uVar7 & 0xffffffff) * 2 + *(long *)(lVar1 + 0x18),uVar6 & 0xffffffff
                         ,0);
        uVar6 = uVar6 + 1;
        uVar7 = uVar7 + (uVar4 >> 1);
      } while (uVar6 < local_34);
    }
    TIFFClose(lVar3);
    PVar8.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    PVar8.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)piStack_40;
    return (Ptr)PVar8.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>;
  }
  pEVar5 = (Exception *)__cxa_allocate_exception(0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"TIFF file bits per sample don\'t match","");
  util::Exception::Exception(pEVar5,&local_70);
  __cxa_throw(pEVar5,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

RawImage::Ptr
load_tiff_16_file (std::string const& filename)
{
    if (sizeof(uint16_t) != 2)
        throw util::Exception("Need 16bit data type for TIFF image.");

    TIFFSetWarningHandler(nullptr);
    TIFFSetErrorHandler(tiff_error_handler);

    TIFF* tif = TIFFOpen(filename.c_str(), "r");
    if (!tif)
        throw util::Exception("TIFF file format not recognized");

    try
    {
        /* Read width and height from TIFF and create MVE image. */
        uint32 width, height;
        uint16 channels, bits;
        TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &width);
        TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &height);
        TIFFGetField(tif, TIFFTAG_SAMPLESPERPIXEL, &channels);
        TIFFGetField(tif, TIFFTAG_BITSPERSAMPLE, &bits);
        if (bits != 16)
            throw util::Exception("TIFF file bits per sample don't match");

        RawImage::Ptr image = Image<uint16_t>::create(width, height, channels);

        /* Scanline based TIFF reading. */
        uint32 rowstride = TIFFScanlineSize(tif) / sizeof(uint16_t);
        Image<uint16_t>::ImageData& data = image->get_data();
        for (uint32 row = 0; row < height; row++)
        {
            tdata_t row_pointer = &data[row * rowstride];
            TIFFReadScanline(tif, row_pointer, row);
        }

        TIFFClose(tif);
        return image;
    }
    catch (std::exception& e)
    {
        TIFFClose(tif);
        throw;
    }
}